

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SmallVector<spirv_cross::Meta::Decoration,_0UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::Meta::Decoration,_0UL>::operator=
          (SmallVector<spirv_cross::Meta::Decoration,_0UL> *this,
          SmallVector<spirv_cross::Meta::Decoration,_0UL> *other)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  if (this != other) {
    clear(this);
    reserve(this,(other->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size);
    if ((other->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size == 0) {
      uVar1 = 0;
    }
    else {
      lVar3 = 0;
      uVar2 = 0;
      do {
        Meta::Decoration::Decoration
                  ((Decoration *)
                   ((long)&(((this->super_VectorView<spirv_cross::Meta::Decoration>).ptr)->alias).
                           _M_dataplus._M_p + lVar3),
                   (Decoration *)
                   ((long)&(((other->super_VectorView<spirv_cross::Meta::Decoration>).ptr)->alias).
                           _M_dataplus._M_p + lVar3));
        uVar2 = uVar2 + 1;
        uVar1 = (other->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size;
        lVar3 = lVar3 + 0x188;
      } while (uVar2 < uVar1);
    }
    (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size = uVar1;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}